

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

bool __thiscall Controller::landPerson(Controller *this,Person *p,Container *currentContainer)

{
  Boat *from;
  ostream *poVar1;
  Container *to;
  undefined1 local_48 [40];
  Container *currentContainer_local;
  Person *p_local;
  Controller *this_local;
  
  local_48._32_8_ = currentContainer;
  currentContainer_local = (Container *)p;
  p_local = (Person *)this;
  if ((Boat *)currentContainer == this->boat) {
    from = this->boat;
    to = &Boat::getBank(this->boat)->super_Container;
    this_local._7_1_ =
         tryMovePerson(this,&from->super_Container,to,(Person *)currentContainer_local);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"La personne ");
    Person::getName_abi_cxx11_((Person *)local_48);
    poVar1 = std::operator<<(poVar1,(string *)local_48);
    poVar1 = std::operator<<(poVar1," n\'est pas sur le bateau");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Controller::landPerson(Person* p, Container* currentContainer) {
    // Checks if the person is on the boat
    if (currentContainer != boat) {
        cout << "La personne " << p->getName() <<
        " n'est pas sur le bateau" << endl;
        return false;
    }

    // Tries to make the move
    return tryMovePerson(boat, boat->getBank(), p);
}